

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_yplus_lengthscale
          (REF_GRID ref_grid,REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_INT ldim,
          REF_DBL *field,REF_DBL *lengthscale)

{
  int *piVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_DBL *pRVar2;
  REF_INT RVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  REF_INT RVar7;
  REF_STATUS RVar8;
  uint uVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  ulong uVar19;
  double y;
  double u;
  REF_INT ntri;
  void *local_1b0;
  REF_DBL tangent [3];
  REF_DBL yplus_dist;
  REF_INT tri_list [2];
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  
  ref_node = ref_grid->node;
  uVar9 = ref_node->max;
  uVar10 = 0;
  uVar19 = 0;
  if (0 < (int)uVar9) {
    uVar19 = (ulong)uVar9;
  }
  for (; uVar19 != uVar10; uVar10 = uVar10 + 1) {
    if (-1 < ref_node->global[uVar10]) {
      lengthscale[uVar10] = 0.0;
    }
  }
  if ((int)uVar9 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2fc,
           "ref_phys_yplus_lengthscale","malloc hits of REF_INT negative");
LAB_001c849d:
    uVar9 = 1;
  }
  else {
    pvVar11 = malloc((ulong)uVar9 << 2);
    if (pvVar11 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2fc,
             "ref_phys_yplus_lengthscale","malloc hits of REF_INT NULL");
      uVar9 = 2;
    }
    else {
      for (uVar10 = 0; uVar19 != uVar10; uVar10 = uVar10 + 1) {
        *(undefined4 *)((long)pvVar11 + uVar10 * 4) = 0;
      }
      if (ref_grid->twod == 0) {
        pcVar17 = "implement 3D";
        uVar9 = 6;
        uVar14 = 0x332;
      }
      else {
        ref_cell = ref_grid->cell[0];
        ref_cell_00 = ref_grid->cell[3];
        local_1b0 = pvVar11;
        for (iVar15 = 0; iVar15 < ref_cell->max; iVar15 = iVar15 + 1) {
          RVar8 = ref_cell_nodes(ref_cell,iVar15,edg_nodes);
          if (RVar8 == 0) {
            uVar9 = ref_layer_interior_seg_normal(ref_grid,iVar15,edg_norm);
            if (uVar9 != 0) {
              pcVar17 = "edge norm";
              uVar14 = 0x309;
              goto LAB_001c8679;
            }
            uVar9 = ref_cell_list_with2(ref_grid->cell[3],edg_nodes[0],edg_nodes[1],2,&ntri,tri_list
                                       );
            if (uVar9 != 0) {
              pcVar17 = "tri with2";
              uVar14 = 0x30c;
              goto LAB_001c8679;
            }
            if ((long)ntri != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x30d,"ref_phys_yplus_lengthscale","edg expects one tri",1,(long)ntri);
              goto LAB_001c849d;
            }
            uVar9 = ref_cell_nodes(ref_cell_00,tri_list[0],tri_nodes);
            RVar7 = tri_nodes[2];
            RVar6 = tri_nodes[1];
            RVar5 = tri_nodes[0];
            RVar4 = edg_nodes[1];
            RVar3 = edg_nodes[0];
            if (uVar9 != 0) {
              pcVar17 = "tri nodes";
              uVar14 = 0x30f;
              goto LAB_001c8679;
            }
            lVar13 = (long)edg_nodes[0];
            lVar16 = (long)edg_nodes[1];
            pRVar2 = ref_node->real;
            tangent[0] = pRVar2[lVar16 * 0xf] - pRVar2[lVar13 * 0xf];
            tangent[1] = pRVar2[lVar16 * 0xf + 1] - pRVar2[lVar13 * 0xf + 1];
            tangent[2] = pRVar2[lVar16 * 0xf + 2] - pRVar2[lVar13 * 0xf + 2];
            uVar9 = ref_math_normalize(tangent);
            if (uVar9 != 0) {
              pcVar17 = "normalize tangent";
              uVar14 = 0x319;
              goto LAB_001c8679;
            }
            iVar18 = (RVar6 + RVar7 + (RVar5 - RVar3)) - RVar4;
            lVar12 = (long)(iVar18 * ldim);
            pRVar2 = ref_node->real;
            lVar16 = (long)(iVar18 * 0xf);
            u = 0.0 - (field[lVar12 + 3] * tangent[2] +
                      field[lVar12 + 1] * tangent[0] + tangent[1] * field[lVar12 + 2]);
            if (u <= -u) {
              u = -u;
            }
            y = (pRVar2[lVar16 + 2] - pRVar2[lVar13 * 0xf + 2]) * edg_norm[2] +
                (pRVar2[lVar16] - pRVar2[lVar13 * 0xf]) * edg_norm[0] +
                (pRVar2[lVar16 + 1] - pRVar2[lVar13 * 0xf + 1]) * edg_norm[1];
            if (y <= -y) {
              y = -y;
            }
            lVar13 = (long)(RVar3 * ldim);
            uVar9 = ref_phys_yplus_dist(mach,re,reference_t_k,field[lVar13],
                                        (field[lVar13 + 4] / field[lVar13]) * 1.4,y,u,&yplus_dist);
            if (uVar9 != 0) {
              pcVar17 = "yplus dist";
              uVar14 = 0x32b;
              goto LAB_001c8679;
            }
            lVar13 = (long)edg_nodes[0];
            lengthscale[lVar13] = lengthscale[lVar13] + yplus_dist;
            piVar1 = (int *)((long)local_1b0 + lVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar13 = (long)edg_nodes[1];
            lengthscale[lVar13] = yplus_dist + lengthscale[lVar13];
            piVar1 = (int *)((long)local_1b0 + lVar13 * 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        uVar19 = 0;
        uVar10 = (ulong)(uint)ref_node->max;
        if (ref_node->max < 1) {
          uVar10 = uVar19;
        }
        for (; uVar10 != uVar19; uVar19 = uVar19 + 1) {
          if ((-1 < ref_node->global[uVar19]) &&
             (iVar15 = *(int *)((long)local_1b0 + uVar19 * 4), 0 < iVar15)) {
            lengthscale[uVar19] = lengthscale[uVar19] / (double)iVar15;
          }
        }
        free(local_1b0);
        uVar9 = ref_node_ghost_dbl(ref_node,lengthscale,1);
        if (uVar9 == 0) {
          return 0;
        }
        pcVar17 = "ghost lengthscale";
        uVar14 = 0x33b;
      }
LAB_001c8679:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar14
             ,"ref_phys_yplus_lengthscale",(ulong)uVar9,pcVar17);
    }
  }
  return uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_lengthscale(REF_GRID ref_grid, REF_DBL mach,
                                              REF_DBL re, REF_DBL reference_t_k,
                                              REF_INT ldim, REF_DBL *field,
                                              REF_DBL *lengthscale) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) { lengthscale[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, du, u0, u1, dxyz[3], edg_norm[3], tangent[3];
    REF_DBL rho, t, yplus_dist;
    REF_DBL gamma = 1.4, press;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      tangent[0] = ref_node_xyz(ref_node, 0, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 0, edg_nodes[0]);
      tangent[1] = ref_node_xyz(ref_node, 1, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 1, edg_nodes[0]);
      tangent[2] = ref_node_xyz(ref_node, 2, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 2, edg_nodes[0]);
      RSS(ref_math_normalize(tangent), "normalize tangent");

      u0 = ref_math_dot(&(field[1 + ldim * on_node]), tangent);
      u1 = ref_math_dot(&(field[1 + ldim * off_node]), tangent);
      u0 = 0.0; /* assume no-slip bc */
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      du = ABS(u0 - u1);
      dn = ABS(ref_math_dot(dxyz, edg_norm));
      rho = field[0 + ldim * on_node];
      press = field[4 + ldim * on_node];
      t = gamma * (press / rho);
      RSS(ref_phys_yplus_dist(mach, re, reference_t_k, rho, t, dn, du,
                              &yplus_dist),
          "yplus dist");
      lengthscale[edg_nodes[0]] += yplus_dist;
      hits[edg_nodes[0]] += 1;
      lengthscale[edg_nodes[1]] += yplus_dist;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      lengthscale[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, lengthscale, 1), "ghost lengthscale");

  return REF_SUCCESS;
}